

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicSharedSimple::Run(BasicSharedSimple *this)

{
  bool bVar1;
  GLuint GVar2;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicSharedSimple *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 128) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nshared uint g_shared_data[128];\nvoid main() {\n  g_shared_data[gl_LocalInvocationID.x] = gl_LocalInvocationIndex;\n  groupMemoryBarrier();\n  barrier();\n  g_output[gl_GlobalInvocationID.x] = 1u;\n  if (gl_LocalInvocationIndex < 127u) {\n    uint res = g_shared_data[gl_LocalInvocationID.x + 1u];\n    if (res != (gl_LocalInvocationIndex + 1u)) {\n      g_output[gl_GlobalInvocationID.x] = 0u;\n    }\n  }\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 128) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nshared uint g_shared_data[128];\nvoid main() {\n  g_shared_data[gl_LocalInvocationID.x] = gl_LocalInvocationIndex;\n  groupMemoryBarrier();\n  barrier();\n  g_output[gl_GlobalInvocationID.x] = 1u;\n  if (gl_LocalInvocationIndex < 127u) {\n    uint res = g_shared_data[gl_LocalInvocationID.x + 1u];\n    if (res != (gl_LocalInvocationIndex + 1u)) {\n      g_output[gl_GlobalInvocationID.x] = 0u;\n    }\n  }\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    bVar1 = RunIteration(this,1,false);
    if (bVar1) {
      bVar1 = RunIteration(this,8,true);
      if (bVar1) {
        bVar1 = RunIteration(this,0xd,false);
        if (bVar1) {
          bVar1 = RunIteration(this,7,true);
          if (bVar1) {
            this_local = (BasicSharedSimple *)0x0;
          }
          else {
            this_local = (BasicSharedSimple *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicSharedSimple *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicSharedSimple *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicSharedSimple *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicSharedSimple *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 128) in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
			   "shared uint g_shared_data[128];" NL "void main() {" NL
			   "  g_shared_data[gl_LocalInvocationID.x] = gl_LocalInvocationIndex;" NL
			   "  groupMemoryBarrier();" // flush memory stores
			NL "  barrier();"			 // wait for all stores to finish
			NL "  g_output[gl_GlobalInvocationID.x] = 1u;" NL "  if (gl_LocalInvocationIndex < 127u) {" NL
			   "    uint res = g_shared_data[gl_LocalInvocationID.x + "
			   "1u];" // load data from shared memory filled by other thread
			NL "    if (res != (gl_LocalInvocationIndex + 1u)) {" NL "      g_output[gl_GlobalInvocationID.x] = 0u;" NL
			   "    }" NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		if (!RunIteration(1, false))
			return ERROR;
		if (!RunIteration(8, true))
			return ERROR;
		if (!RunIteration(13, false))
			return ERROR;
		if (!RunIteration(7, true))
			return ERROR;
		return NO_ERROR;
	}